

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O0

bool __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPointAtLevel
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,Image<const_unsigned_short> *img_2,
          PatchT *dp,AffineCompact2f *transform)

{
  bool bVar1;
  bool bVar2;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>_> *this_00;
  double __x;
  TranslationPart local_3e8;
  undefined4 local_3b8;
  SE2Base<Sophus::SE2<float,_0>_> local_3b4 [4];
  int filter_margin;
  Transformation local_3a4;
  NegativeReturnType local_380;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>
  local_370;
  Matrix<float,3,1,0,3,1> local_358 [8];
  Vector3 inc;
  bool valid;
  TranslationPart local_340;
  LinearPart local_310;
  Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>
  local_2e0;
  undefined1 local_2a8 [8];
  Matrix2P transformed_pat;
  VectorP res;
  int local_30;
  int iteration;
  bool patch_valid;
  AffineCompact2f *transform_local;
  PatchT *dp_local;
  Image<const_unsigned_short> *img_2_local;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> *this_local;
  
  bVar1 = true;
  for (local_30 = 0; bVar1 != false && local_30 < 5; local_30 = local_30 + 1) {
    Eigen::Matrix<float,_52,_1,_0,_52,_1>::Matrix
              ((Matrix<float,_52,_1,_0,_52,_1> *)
               (transformed_pat.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                m_storage.m_data.array + 0x66));
    Eigen::Transform<float,_2,_18,_0>::linear(&local_310,transform);
    this_00 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>_>::
              matrix((MatrixBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>_> *)
                     &local_310);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,2,true>>::operator*
              (&local_2e0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,2,true>> *)this_00,
               (MatrixBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_> *)
               OpticalFlowPatch<float,vo::Pattern51<float>>::pattern2);
    Eigen::Matrix<float,2,52,0,2,52>::
    Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,2,true>,Eigen::Matrix<float,2,52,0,2,52>,0>>
              ((Matrix<float,2,52,0,2,52> *)local_2a8,
               (EigenBase<Eigen::Product<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_2,_true>,_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_0>_>
                *)&local_2e0);
    Eigen::Transform<float,_2,_18,_0>::translation(&local_340,transform);
    register0x00000000 =
         Eigen::DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>::colwise
                   ((DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_> *)local_2a8);
    Eigen::VectorwiseOp<Eigen::Matrix<float,2,52,0,2,52>,0>::operator+=
              ((VectorwiseOp<Eigen::Matrix<float,2,52,0,2,52>,0> *)
               (inc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_1,_true>_> *)
               &local_340);
    inc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._3_1_
         = OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
                     (dp,img_2,(Matrix2P *)local_2a8,
                      (VectorP *)
                      (transformed_pat.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>
                       .m_storage.m_data.array + 0x66));
    if ((bool)inc.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1]._3_1_) {
      Eigen::DenseBase<Eigen::Matrix<float,_3,_52,_0,_3,_52>_>::operator-
                (&local_380,
                 (DenseBase<Eigen::Matrix<float,_3,_52,_0,_3,_52>_> *)&dp->H_se2_inv_J_se2_T);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,52,0,3,52>const>>
      ::operator*(&local_370,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,52,0,3,52>const>>
                   *)&local_380,
                  (MatrixBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_> *)
                  (transformed_pat.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                   m_storage.m_data.array + 0x66));
      Eigen::Matrix<float,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,52,0,3,52>const>,Eigen::Matrix<float,52,1,0,52,1>,0>>
                (local_358,
                 (EigenBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>_>
                  *)&local_370);
      Sophus::SE2Base<Sophus::SE2<float,_0>_>::exp(local_3b4,__x);
      Sophus::SE2Base<Sophus::SE2<float,_0>_>::matrix(&local_3a4,local_3b4);
      Eigen::Transform<float,2,18,0>::operator*=
                ((Transform<float,2,18,0> *)transform,
                 (EigenBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_3a4);
      local_3b8 = 2;
      Eigen::Transform<float,_2,_18,_0>::translation(&local_3e8,transform);
      bVar2 = Image<unsigned_short_const>::
              InBounds<Eigen::Block<Eigen::Matrix<float,2,3,0,2,3>,2,1,true>>
                        ((Image<unsigned_short_const> *)img_2,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<float,_2,_3,_0,_2,_3>,_2,_1,_true>_>
                          *)&local_3e8,2.0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

inline bool trackPointAtLevel(const Image<const u_int16_t>& img_2,
                                const PatchT& dp,
                                Eigen::AffineCompact2f& transform) const {
    bool patch_valid = true;

    for (int iteration = 0;
         patch_valid && iteration < optical_flow_max_iterations; iteration++) {
      typename PatchT::VectorP res;

      typename PatchT::Matrix2P transformed_pat =
          transform.linear().matrix() * PatchT::pattern2;
      transformed_pat.colwise() += transform.translation();

      bool valid = dp.residual(img_2, transformed_pat, res);

      if (valid) {
        Vector3 inc = -dp.H_se2_inv_J_se2_T * res;
        transform *= SE2::exp(inc).matrix();

        const int filter_margin = 2;

        if (!img_2.InBounds(transform.translation(), filter_margin))
          patch_valid = false;
      } else {
        patch_valid = false;
      }
    }

    return patch_valid;
  }